

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int use_container(obj *obj,int held)

{
  obj *poVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *planB;
  bool bVar8;
  bool bVar9;
  char *local_378;
  char local_358 [6];
  boolean inokay;
  boolean outokay;
  char menuprompt [256];
  int t;
  int menu_on_request;
  int used;
  int cnt;
  long loss;
  char emptymsg [256];
  char qbuf [256];
  boolean loot_in;
  boolean loot_out;
  boolean quantum_cat;
  obj *otmp;
  obj *curr;
  int held_local;
  obj *obj_local;
  
  bVar8 = false;
  bVar9 = false;
  _used = 0;
  menu_on_request = 0;
  t = 0;
  loss._0_1_ = 0;
  if (((youmonst.data)->mflags1 & 0x2000) == 0) {
    iVar3 = freehand();
    if (iVar3 == 0) {
      pcVar5 = body_part(6);
      pline("You have no free %s.",pcVar5);
      obj_local._4_4_ = 0;
    }
    else {
      if (obj != &zeroobj) {
        if ((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) {
          pcVar5 = Tobjnam(obj,"seem");
          pline("%s to be locked.",pcVar5);
          if (held != 0) {
            pline("You must put it down to unlock.");
          }
          return 0;
        }
        if ((*(uint *)&obj->field_0x4a >> 0xf & 1) != 0) {
          if (held != 0) {
            pcVar5 = xname(obj);
            pcVar5 = the(pcVar5);
            pline("You open %s...",pcVar5);
          }
          chest_trap(obj,6,'\0');
          if (-1 < multi) {
            nomul(-1,"opening a trapped container");
            nomovemsg = "";
          }
          return 1;
        }
      }
      current_container = obj;
      if ((obj != &zeroobj) && (obj->spe == '\x01')) {
        observe_quantum_cat(obj);
        t = 1;
        bVar8 = true;
      }
      if (obj == &zeroobj) {
        otmp = magic_chest_objs;
      }
      else {
        otmp = obj->cobj;
      }
      while (otmp != (obj *)0x0) {
        poVar1 = otmp->nobj;
        if ((obj == &zeroobj) ||
           ((((obj->otyp != 0xe0 && (obj->otyp != 0xe1)) || ((*(uint *)&obj->field_0x4a & 1) == 0))
            || (iVar3 = rn2(0xd), iVar3 != 0)))) {
          menu_on_request = menu_on_request + 1;
          otmp = poVar1;
        }
        else {
          obj_extract_self(otmp);
          lVar6 = mbag_item_gone(held,otmp);
          _used = lVar6 + _used;
          t = 1;
          otmp = poVar1;
        }
      }
      if (_used != 0) {
        pcVar5 = currency(_used);
        pline("You owe %ld %s for lost merchandise.",_used,pcVar5);
      }
      if (obj != &zeroobj) {
        uVar4 = weight(obj);
        obj->owt = uVar4;
      }
      if (menu_on_request == 0) {
        if (obj == &zeroobj) {
          local_378 = "The magic chest";
        }
        else {
          local_378 = Yname2(obj);
        }
        pcVar5 = "";
        if (bVar8) {
          pcVar5 = "now ";
        }
        sprintf((char *)&loss,"%s is %sempty.",local_378,pcVar5);
      }
      if ((menu_on_request == 0) && (flags.menu_style != '\x03')) {
        pline("%s",&loss);
      }
      else {
        strcpy(emptymsg + 0xf8,"Do you want to take something out of ");
        if (obj == &zeroobj) {
          pcVar5 = eos(emptymsg + 0xf8);
          sprintf(pcVar5,"the magic chest?");
        }
        else {
          pcVar5 = eos(emptymsg + 0xf8);
          pcVar7 = yname(obj);
          planB = ysimple_name(obj);
          pcVar7 = safe_qbuf(emptymsg + 0xf8,1,pcVar7,planB,"it");
          sprintf(pcVar5,"%s?",pcVar7);
        }
        if (flags.menu_style == '\x03') {
          bVar8 = invent != (obj *)0x0;
          if ((menu_on_request == 0) && (!bVar8)) {
            pline("%s",&loss);
            pline("You don\'t have anything to put in.");
            return t;
          }
          local_358[0] = '\0';
          if (menu_on_request == 0) {
            sprintf(local_358,"%s ",&loss);
          }
          strcat(local_358,"Do what?");
          uVar4 = in_or_out_menu(local_358,current_container,menu_on_request != 0,bVar8);
          if ((int)uVar4 < 1) {
            return 0;
          }
          bVar8 = (uVar4 & 1) != 0;
          bVar9 = (uVar4 & 2) != 0;
        }
        else {
          cVar2 = yn_function(emptymsg + 0xf8,"ynq",'n');
          bVar8 = cVar2 == 'y';
        }
        if (bVar8) {
          add_valid_menu_class(0);
          iVar3 = menu_loot(0,current_container,'\0');
          t = (uint)(0 < iVar3) | t;
        }
      }
      if (invent == (obj *)0x0) {
        pline("You don\'t have anything to put in.");
        obj_local._4_4_ = t;
      }
      else {
        if (flags.menu_style != '\x03') {
          sprintf(emptymsg + 0xf8,"Do you wish to put something in?");
          cVar2 = yn_function(emptymsg + 0xf8,"ynq",'n');
          switch(cVar2) {
          case 'm':
            add_valid_menu_class(0);
            iVar3 = menu_loot(-2,current_container,'\x01');
            t = (uint)(0 < iVar3) | t;
            break;
          case 'n':
            break;
          default:
            return t;
          case 'q':
            return t;
          case 'y':
            bVar9 = true;
          }
        }
        if (bVar9) {
          add_valid_menu_class(0);
          iVar3 = menu_loot(0,current_container,'\x01');
          t = (uint)(0 < iVar3) | t;
        }
        obj_local._4_4_ = t;
      }
    }
  }
  else {
    pline("You have no hands!");
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

int use_container(struct obj *obj, int held)
{
	struct obj *curr, *otmp;
	boolean quantum_cat = FALSE,
		loot_out = FALSE, loot_in = FALSE;
	char qbuf[BUFSZ], emptymsg[BUFSZ];
	long loss = 0L;
	int cnt = 0, used = 0,
	    menu_on_request;

	emptymsg[0] = '\0';
	if (nohands(youmonst.data)) {
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}

	if (!cobj_is_magic_chest(obj)) {
	    if (obj->olocked) {
		pline("%s to be locked.", Tobjnam(obj, "seem"));
		if (held) pline("You must put it down to unlock.");
		return 0;
	    } else if (obj->otrapped) {
		if (held) pline("You open %s...", the(xname(obj)));
		chest_trap(obj, HAND, FALSE);
		/* even if the trap fails, you've used up this turn */
		if (multi >= 0) {	/* in case we didn't become paralyzed */
		    nomul(-1, "opening a trapped container");
		    nomovemsg = "";
		}
		return 1;
	    }
	}

	current_container = obj;	/* for use by in/out_container */

	if (!cobj_is_magic_chest(obj) && obj->spe == 1) {
	    observe_quantum_cat(obj);
	    used = 1;
	    quantum_cat = TRUE;	/* for adjusting "it's empty" message */
	}

	/* Count the number of contained objects. Sometimes toss objects if */
	/* a cursed magic bag.						    */
	if (cobj_is_magic_chest(obj))
	    curr = magic_chest_objs;
	else
	    curr = obj->cobj;
	for (; curr; curr = otmp) {
	    otmp = curr->nobj;
	    if (!cobj_is_magic_chest(obj) && Is_mbag(obj) && obj->cursed && !rn2(13)) {
		obj_extract_self(curr);
		loss += mbag_item_gone(held, curr);
		used = 1;
	    } else {
		cnt++;
	    }
	}

	if (loss)	/* magic bag lost some shop goods */
	    pline("You owe %ld %s for lost merchandise.", loss, currency(loss));
	if (!cobj_is_magic_chest(obj))
	    obj->owt = weight(obj);	/* in case any items were lost */

	if (!cnt) {
	    sprintf(emptymsg, "%s is %sempty.",
		    cobj_is_magic_chest(obj) ? "The magic chest" : Yname2(obj),
		    quantum_cat ? "now " : "");
	}

	if (cnt || flags.menu_style == MENU_FULL) {
	    strcpy(qbuf, "Do you want to take something out of ");
	    if (cobj_is_magic_chest(obj)) {
		sprintf(eos(qbuf), "the magic chest?");
	    } else {
		sprintf(eos(qbuf), "%s?",
			safe_qbuf(qbuf, 1, yname(obj), ysimple_name(obj), "it"));
	    }

	    if (flags.menu_style == MENU_FULL) {
		int t;
		char menuprompt[BUFSZ];
		boolean outokay = (cnt != 0);
		boolean inokay = (invent != 0);

		if (!outokay && !inokay) {
		    pline("%s", emptymsg);
		    pline("You don't have anything to put in.");
		    return used;
		}
		menuprompt[0] = '\0';
		if (!cnt) sprintf(menuprompt, "%s ", emptymsg);
		strcat(menuprompt, "Do what?");
		t = in_or_out_menu(menuprompt, current_container, outokay, inokay);
		if (t <= 0) return 0;
		loot_out = (t & 0x01) != 0;
		loot_in  = (t & 0x02) != 0;
	    } else {	/* MENU_PARTIAL */
		loot_out = (yn_function(qbuf, ynqchars, 'n') == 'y');
	    }
	    
	    if (loot_out) {
		add_valid_menu_class(0);	/* reset */
		used |= menu_loot(0, current_container, FALSE) > 0;
	    }
	    
	} else {
	    pline("%s", emptymsg);		/* <whatever> is empty. */
	}

	if (!invent) {
	    /* nothing to put in, but some feedback is necessary */
	    pline("You don't have anything to put in.");
	    return used;
	}
	if (flags.menu_style != MENU_FULL) {
	    sprintf(qbuf, "Do you wish to put something in?");

	    switch (yn_function(qbuf, ynqchars, 'n')) {
		case 'y':
		    loot_in = TRUE;
		    break;
		case 'n':
		    break;
		case 'm':
		    add_valid_menu_class(0);	  /* reset */
		    menu_on_request = -2; /* triggers ALL_CLASSES */
		    used |= menu_loot(menu_on_request, current_container, TRUE) > 0;
		    break;
		case 'q':
		default:
		    return used;
	    }
	}
	/*
	 * Gone: being nice about only selecting food if we know we are
	 * putting things in an ice chest.
	 */
	if (loot_in) {
	    add_valid_menu_class(0);	  /* reset */
	    used |= menu_loot(0, current_container, TRUE) > 0;
	}

	return used;
}